

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O3

void __thiscall
leveldb::InternalKey::InternalKey(InternalKey *this,Slice *user_key,SequenceNumber s,ValueType t)

{
  long in_FS_OFFSET;
  ParsedInternalKey local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->rep_)._M_dataplus._M_p = (pointer)&(this->rep_).field_2;
  (this->rep_)._M_string_length = 0;
  (this->rep_).field_2._M_local_buf[0] = '\0';
  local_48.user_key.data_ = user_key->data_;
  local_48.user_key.size_ = user_key->size_;
  local_48.sequence = s;
  local_48.type = t;
  AppendInternalKey(&this->rep_,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

InternalKey(const Slice& user_key, SequenceNumber s, ValueType t) {
    AppendInternalKey(&rep_, ParsedInternalKey(user_key, s, t));
  }